

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O0

int Cec_ManSimulationOne(Gia_Man_t *pAig,Cec_ParSim_t *pPars)

{
  abctime aVar1;
  Cec_ManSim_t *p;
  abctime aVar2;
  abctime clkTotal;
  int RetValue;
  Cec_ManSim_t *pSim;
  Cec_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  clkTotal._4_4_ = 0;
  aVar1 = Abc_Clock();
  p = Cec_ManSimStart(pAig,pPars);
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    clkTotal._4_4_ = Cec_ManSimClassesPrepare(p,-1);
    if (clkTotal._4_4_ == 0) goto LAB_007e5b05;
  }
  else {
LAB_007e5b05:
    if (clkTotal._4_4_ != 0) goto LAB_007e5b44;
    clkTotal._4_4_ = Cec_ManSimClassesRefine(p);
    if (clkTotal._4_4_ == 0) goto LAB_007e5b44;
  }
  Abc_Print(1,"The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n",
            (ulong)(uint)p->nOuts,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames);
LAB_007e5b44:
  if (pPars->fVerbose != 0) {
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar2 - aVar1);
  }
  Cec_ManSimStop(p);
  return clkTotal._4_4_;
}

Assistant:

int Cec_ManSimulationOne( Gia_Man_t * pAig, Cec_ParSim_t * pPars )
{
    Cec_ManSim_t * pSim;
    int RetValue = 0;
    abctime clkTotal = Abc_Clock();
    pSim = Cec_ManSimStart( pAig, pPars );
    if ( (pAig->pReprs == NULL && (RetValue = Cec_ManSimClassesPrepare( pSim, -1 ))) ||
         (RetValue == 0 &&        (RetValue = Cec_ManSimClassesRefine( pSim ))) )
        Abc_Print( 1, "The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n", 
            pSim->nOuts, pPars->nWords, pPars->nFrames );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    Cec_ManSimStop( pSim );
    return RetValue;
}